

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<google::protobuf::RepeatedFieldRef<std::__cxx11::string,void>,void>
               (RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *container,ostream *os)

{
  bool bVar1;
  long lVar2;
  iterator __begin0;
  iterator __end0;
  IteratorValueType local_50;
  
  std::operator<<(os,'{');
  google::protobuf::
  RepeatedFieldRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::begin(&__begin0,container);
  __end0.data_ = container->data_;
  __end0.accessor_ = container->accessor_;
  __end0.iterator_ = (void *)(**(code **)(*(long *)__end0.accessor_ + 0x50))();
  __end0.scratch_space_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  lVar2 = 0;
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__begin0,&__end0);
    if (!bVar1) break;
    google::protobuf::internal::
    RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_50,&__begin0);
    if (lVar2 == 0) {
LAB_0078d345:
      std::operator<<(os,' ');
      PrintStringTo(&local_50,os);
      lVar2 = lVar2 + 1;
      bVar1 = true;
    }
    else {
      std::operator<<(os,',');
      if (lVar2 != 0x20) goto LAB_0078d345;
      std::operator<<(os," ...");
      bVar1 = false;
      lVar2 = 0x20;
    }
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) break;
    __begin0.iterator_ =
         (void *)(**(code **)(*(long *)__begin0.accessor_ + 0x60))
                           (__begin0.accessor_,__begin0.data_,__begin0.iterator_);
  }
  google::protobuf::internal::
  RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedFieldRefIterator(&__end0);
  google::protobuf::internal::
  RepeatedFieldRefIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedFieldRefIterator(&__begin0);
  if (lVar2 != 0) {
    std::operator<<(os,' ');
  }
  std::operator<<(os,'}');
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }